

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRr.c
# Opt level: O3

Vec_Str_t * Abc_NtkRRSimulate(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  int iVar2;
  long *plVar3;
  void *pvVar4;
  long lVar5;
  void *pvVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  Vec_Str_t *vTargets;
  char *__s;
  Abc_Obj_t *pAVar10;
  Vec_Ptr_t *vNodes;
  void **ppvVar11;
  int *piVar12;
  Vec_Ptr_t *pVVar13;
  Vec_Ptr_t *pVVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong local_50;
  
  pVVar13 = pNtk->vObjs;
  uVar1 = pVVar13->nSize;
  uVar17 = (ulong)(int)uVar1;
  vTargets = (Vec_Str_t *)malloc(0x10);
  iVar8 = (int)(uVar17 + 1);
  iVar7 = 0x10;
  if (0xe < uVar17) {
    iVar7 = iVar8;
  }
  vTargets->nCap = iVar7;
  if (iVar7 == 0) {
    __s = (char *)0x0;
  }
  else {
    __s = (char *)malloc((long)iVar7);
  }
  vTargets->pArray = __s;
  vTargets->nSize = iVar8;
  memset(__s,0,uVar17 + 1);
  if (0 < (int)uVar1) {
    ppvVar11 = pVVar13->pArray;
    uVar15 = 0;
    do {
      plVar3 = (long *)ppvVar11[uVar15];
      if ((plVar3 != (long *)0x0) && ((*(uint *)((long)plVar3 + 0x14) & 0xf) == 7)) {
        if (uVar1 < *(uint *)(plVar3 + 2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecStr.h"
                        ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
        }
        lVar16 = *(long *)(*(long *)(*plVar3 + 0x20) + 8);
        __s[*(uint *)(plVar3 + 2)] =
             1 < *(int *)(*(long *)(lVar16 + (long)*(int *)plVar3[4] * 8) + 0x2c) |
             (1 < *(int *)(*(long *)(lVar16 + (long)((int *)plVar3[4])[1] * 8) + 0x2c)) * '\x02';
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 < uVar17);
  }
  pAVar10 = Abc_AigConst1(pNtk);
  pAVar10->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)0xffffffff;
  pVVar13 = pNtk->vCis;
  if (0 < pVVar13->nSize) {
    lVar16 = 0;
    do {
      pvVar4 = pVVar13->pArray[lVar16];
      iVar7 = rand();
      iVar8 = rand();
      uVar9 = rand();
      *(ulong *)((long)pvVar4 + 0x40) = (ulong)(uVar9 ^ iVar8 << 0xc ^ iVar7 << 0x18);
      lVar16 = lVar16 + 1;
      pVVar13 = pNtk->vCis;
    } while (lVar16 < pVVar13->nSize);
  }
  pVVar13 = pNtk->vObjs;
  if (0 < pVVar13->nSize) {
    lVar16 = 0;
    do {
      plVar3 = (long *)pVVar13->pArray[lVar16];
      if (((plVar3 != (long *)0x0) && (lVar16 != 0)) &&
         (uVar9 = *(uint *)((long)plVar3 + 0x14), (uVar9 & 0xf) == 7)) {
        lVar5 = *(long *)(*(long *)(*plVar3 + 0x20) + 8);
        plVar3[8] = (ulong)(((int)(uVar9 << 0x14) >> 0x1f ^
                            *(uint *)(*(long *)(lVar5 + (long)((int *)plVar3[4])[1] * 8) + 0x38)) &
                           ((int)(uVar9 << 0x15) >> 0x1f ^
                           *(uint *)(*(long *)(lVar5 + (long)*(int *)plVar3[4] * 8) + 0x38)));
        pVVar13 = pNtk->vObjs;
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < pVVar13->nSize);
  }
  pVVar13 = pNtk->vCos;
  if (0 < pVVar13->nSize) {
    lVar16 = 0;
    do {
      plVar3 = (long *)pVVar13->pArray[lVar16];
      uVar15 = (ulong)*(uint *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                         (long)*(int *)plVar3[4] * 8) + 0x38);
      uVar17 = uVar15 ^ 0xffffffff;
      if ((*(uint *)((long)plVar3 + 0x14) >> 10 & 1) == 0) {
        uVar17 = uVar15;
      }
      plVar3[7] = uVar17;
      lVar16 = lVar16 + 1;
      pVVar13 = pNtk->vCos;
    } while (lVar16 < pVVar13->nSize);
  }
  pVVar13 = pNtk->vCis;
  if (0 < pVVar13->nSize) {
    local_50 = 0;
    do {
      vNodes = (Vec_Ptr_t *)malloc(0x10);
      vNodes->nCap = 10;
      vNodes->nSize = 0;
      ppvVar11 = (void **)malloc(0x50);
      vNodes->pArray = ppvVar11;
      piVar12 = (pNtk->vTravIds).pArray;
      if (piVar12 == (int *)0x0) {
        iVar7 = pNtk->vObjs->nSize;
        uVar17 = (long)iVar7 + 500;
        iVar8 = (int)uVar17;
        if ((pNtk->vTravIds).nCap < iVar8) {
          piVar12 = (int *)malloc(uVar17 * 4);
          (pNtk->vTravIds).pArray = piVar12;
          if (piVar12 == (int *)0x0) goto LAB_0029f6f6;
          (pNtk->vTravIds).nCap = iVar8;
        }
        else {
          piVar12 = (int *)0x0;
        }
        if (-500 < iVar7) {
          memset(piVar12,0,(uVar17 & 0xffffffff) << 2);
        }
        (pNtk->vTravIds).nSize = iVar8;
      }
      iVar7 = pNtk->nTravIds;
      pNtk->nTravIds = iVar7 + 1;
      if (0x3ffffffe < iVar7) {
LAB_0029f6d7:
        __assert_fail("p->nTravIds < (1<<30)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                      ,0x197,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
      }
      uVar17 = 0;
      iVar7 = (int)local_50;
      if (iVar7 < pVVar13->nSize) {
        local_50 = local_50 & 0xffffffff;
        do {
          if (iVar7 < 0) goto LAB_0029f699;
          Sim_TraverseNodes_rec((Abc_Obj_t *)pVVar13->pArray[local_50],vTargets,vNodes);
          uVar17 = (ulong)(uint)vNodes->nSize;
          if (0x80 < vNodes->nSize) break;
          local_50 = local_50 + 1;
          pVVar13 = pNtk->vCis;
        } while ((int)local_50 < pVVar13->nSize);
        piVar12 = (pNtk->vTravIds).pArray;
      }
      pVVar13 = (Vec_Ptr_t *)malloc(0x10);
      pVVar13->nCap = 10;
      pVVar13->nSize = 0;
      ppvVar11 = (void **)malloc(0x50);
      pVVar13->pArray = ppvVar11;
      if (piVar12 == (int *)0x0) {
        iVar7 = pNtk->vObjs->nSize;
        uVar15 = (long)iVar7 + 500;
        iVar8 = (int)uVar15;
        if ((pNtk->vTravIds).nCap < iVar8) {
          piVar12 = (int *)malloc(uVar15 * 4);
          (pNtk->vTravIds).pArray = piVar12;
          if (piVar12 == (int *)0x0) {
LAB_0029f6f6:
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          (pNtk->vTravIds).nCap = iVar8;
        }
        else {
          piVar12 = (int *)0x0;
        }
        if (-500 < iVar7) {
          memset(piVar12,0,(uVar15 & 0xffffffff) << 2);
        }
        (pNtk->vTravIds).nSize = iVar8;
      }
      iVar7 = pNtk->nTravIds;
      pNtk->nTravIds = iVar7 + 1;
      if (0x3ffffffe < iVar7) goto LAB_0029f6d7;
      pVVar14 = pNtk->vCos;
      iVar7 = (int)uVar17;
      if (pVVar14->nSize < 1) {
        Sim_UtilInfoAlloc(0,iVar7,0);
      }
      else {
        lVar16 = 0;
        do {
          Sim_CollectNodes_rec((Abc_Obj_t *)pVVar14->pArray[lVar16],pVVar13);
          lVar16 = lVar16 + 1;
          pVVar14 = pNtk->vCos;
        } while (lVar16 < pVVar14->nSize);
        iVar8 = pVVar13->nSize;
        pVVar14 = Sim_UtilInfoAlloc(iVar8,iVar7,0);
        if (0 < (long)iVar8) {
          ppvVar11 = pVVar13->pArray;
          lVar16 = 0;
          do {
            plVar3 = (long *)ppvVar11[lVar16];
            uVar9 = *(uint *)((long)plVar3 + 0x14) & 0xf;
            if ((uVar9 == 5) || (uVar9 == 2)) {
              if (pVVar14->nSize <= lVar16) goto LAB_0029f699;
              if (0 < iVar7) {
                pvVar4 = pVVar14->pArray[lVar16];
                uVar15 = 0;
                do {
                  *(int *)((long)pvVar4 + uVar15 * 4) = (int)plVar3[8];
                  uVar15 = uVar15 + 1;
                } while (uVar17 != uVar15);
              }
            }
            else if (0xfffffffd < uVar9 - 5) {
              if (((pVVar14->nSize <= lVar16) ||
                  (uVar9 = (uint)*(undefined8 *)
                                  (*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                            (long)*(int *)plVar3[4] * 8) + 0x38), (int)uVar9 < 0))
                 || ((uint)pVVar14->nSize <= uVar9)) {
LAB_0029f699:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              pvVar4 = pVVar14->pArray[lVar16];
              pvVar6 = pVVar14->pArray[uVar9 & 0x7fffffff];
              if ((*(uint *)((long)plVar3 + 0x14) >> 10 & 1) == 0) {
                if (0 < iVar7) {
                  uVar15 = 0;
                  do {
                    *(undefined4 *)((long)pvVar4 + uVar15 * 4) =
                         *(undefined4 *)((long)pvVar6 + uVar15 * 4);
                    uVar15 = uVar15 + 1;
                  } while (uVar17 != uVar15);
LAB_0029f5c7:
                  if (0 < iVar7) {
                    uVar15 = 0;
                    do {
                      if (*(int *)((long)pvVar4 + uVar15 * 4) != (int)plVar3[7]) {
                        iVar2 = *(int *)(((ulong)vNodes->pArray[uVar15] & 0xfffffffffffffffe) + 0x10
                                        );
                        if (((long)iVar2 < 0) || ((int)uVar1 < iVar2)) {
                          __assert_fail("i >= 0 && i < p->nSize",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecStr.h"
                                        ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
                        }
                        __s[iVar2] = __s[iVar2] & ((byte)vNodes->pArray[uVar15] & 1) + 1;
                      }
                      uVar15 = uVar15 + 1;
                    } while (uVar17 != uVar15);
                  }
                }
              }
              else if (0 < iVar7) {
                uVar15 = 0;
                do {
                  *(uint *)((long)pvVar4 + uVar15 * 4) = ~*(uint *)((long)pvVar6 + uVar15 * 4);
                  uVar15 = uVar15 + 1;
                } while (uVar17 != uVar15);
                goto LAB_0029f5c7;
              }
            }
            lVar16 = lVar16 + 1;
          } while (lVar16 != iVar8);
        }
      }
      if (vNodes->pArray != (void **)0x0) {
        free(vNodes->pArray);
      }
      free(vNodes);
      pVVar13 = pNtk->vCis;
    } while ((int)local_50 < pVVar13->nSize);
  }
  pVVar13 = pNtk->vObjs;
  if (0 < pVVar13->nSize) {
    lVar16 = 0;
    do {
      if (pVVar13->pArray[lVar16] != (void *)0x0) {
        *(undefined8 *)((long)pVVar13->pArray[lVar16] + 0x38) = 0;
        pVVar13 = pNtk->vObjs;
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < pVVar13->nSize);
  }
  return vTargets;
}

Assistant:

Vec_Str_t * Abc_NtkRRSimulate( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes, * vField;
    Vec_Str_t * vTargets;
    Abc_Obj_t * pObj;
    unsigned uData, uData0, uData1;
    int PrevCi, Phase, i, k;

    // start the candidates
    vTargets = Vec_StrStart( Abc_NtkObjNumMax(pNtk) + 1 );
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        Phase = ((Abc_ObjFanoutNum(Abc_ObjFanin1(pObj)) > 1) << 1);
        Phase |= (Abc_ObjFanoutNum(Abc_ObjFanin0(pObj)) > 1);
        Vec_StrWriteEntry( vTargets, pObj->Id, (char)Phase );
    }

    // simulate patters and store them in copy
    Abc_AigConst1(pNtk)->pCopy = (Abc_Obj_t *)~((unsigned)0);
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)SIM_RANDOM_UNSIGNED;
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        if ( i == 0 ) continue;
        uData0 = (unsigned)(ABC_PTRUINT_T)Abc_ObjFanin0(pObj)->pData;
        uData1 = (unsigned)(ABC_PTRUINT_T)Abc_ObjFanin1(pObj)->pData;
        uData  = Abc_ObjFaninC0(pObj)? ~uData0 : uData0;
        uData &= Abc_ObjFaninC1(pObj)? ~uData1 : uData1;
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)uData;
    }
    // store the result in data
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        uData0 = (unsigned)(ABC_PTRUINT_T)Abc_ObjFanin0(pObj)->pData;
        if ( Abc_ObjFaninC0(pObj) )
            pObj->pData = (void *)(ABC_PTRUINT_T)~uData0;
        else
            pObj->pData = (void *)(ABC_PTRUINT_T)uData0;
    }

    // refine the candidates
    for ( PrevCi = 0; PrevCi < Abc_NtkCiNum(pNtk); PrevCi = i )
    {
        vNodes = Vec_PtrAlloc( 10 );
        Abc_NtkIncrementTravId( pNtk );
        for ( i = PrevCi; i < Abc_NtkCiNum(pNtk); i++ )
        {
            Sim_TraverseNodes_rec( Abc_NtkCi(pNtk, i), vTargets, vNodes );
            if ( Vec_PtrSize(vNodes) > 128 )
                break;
        }
        // collect the marked nodes in the topological order
        vField = Vec_PtrAlloc( 10 );
        Abc_NtkIncrementTravId( pNtk );
        Abc_NtkForEachCo( pNtk, pObj, k )
            Sim_CollectNodes_rec( pObj, vField );

        // simulate these nodes
        Sim_SimulateCollected( vTargets, vNodes, vField );
        // prepare for the next loop
        Vec_PtrFree( vNodes );
    }

    // clean
    Abc_NtkForEachObj( pNtk, pObj, i )
        pObj->pData = NULL;
    return vTargets;
}